

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

void __thiscall QExpandingLineEdit::changeEvent(QExpandingLineEdit *this,QEvent *e)

{
  Type TVar1;
  QEvent *in_RSI;
  QLineEdit *in_stack_00000028;
  
  TVar1 = QEvent::type(in_RSI);
  if (((TVar1 == FontChange) || (TVar1 == StyleChange)) || (TVar1 == ContentsRectChange)) {
    updateMinimumWidth((QExpandingLineEdit *)e);
  }
  QLineEdit::changeEvent(in_stack_00000028,(QEvent *)this);
  return;
}

Assistant:

void QExpandingLineEdit::changeEvent(QEvent *e)
{
    switch (e->type())
    {
    case QEvent::FontChange:
    case QEvent::StyleChange:
    case QEvent::ContentsRectChange:
        updateMinimumWidth();
        break;
    default:
        break;
    }

    QLineEdit::changeEvent(e);
}